

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unaryop_x86_avx.cpp
# Opt level: O0

int ncnn::unary_op_inplace<ncnn::UnaryOp_x86_avx_functor::unary_op_cos>(Mat *a,Option *opt)

{
  undefined1 auVar1 [32];
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined8 uVar6;
  undefined8 uVar7;
  undefined8 uVar8;
  undefined8 uVar9;
  undefined8 uVar10;
  undefined8 uVar11;
  undefined8 uVar12;
  undefined8 uVar13;
  undefined8 uVar14;
  undefined8 uVar15;
  undefined8 uVar16;
  undefined8 uVar17;
  undefined8 uVar18;
  undefined8 uVar19;
  undefined8 uVar20;
  undefined8 uVar21;
  undefined1 auVar22 [32];
  undefined1 auVar23 [32];
  undefined1 auVar24 [32];
  undefined1 auVar25 [32];
  undefined1 auVar26 [32];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [32];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [24];
  undefined1 auVar51 [24];
  long *in_RDI;
  float fVar52;
  float fVar54;
  float fVar55;
  float fVar56;
  float fVar57;
  float fVar58;
  float fVar59;
  float fVar60;
  float fVar61;
  float fVar62;
  float fVar63;
  float fVar64;
  float fVar65;
  undefined1 auVar53 [32];
  __m128 _p_1;
  __m256 _p;
  int i;
  float *ptr;
  int q;
  int size;
  int elempack;
  int channels;
  int d;
  int h;
  int w;
  unary_op_cos op;
  Mat *m;
  __m256 y2;
  __m256 z;
  __m256 poly_mask;
  __m256 sign_bit;
  imm_xmm_union u_3;
  imm_xmm_union u_2;
  imm_xmm_union u_1;
  imm_xmm_union u;
  __m128i imm2_2;
  __m128i imm2_1;
  __m128i imm0_2;
  __m128i imm0_1;
  __m256i imm2;
  __m256i imm0;
  __m256 y;
  __m256 xmm3;
  __m256 xmm2;
  __m256 xmm1;
  v4sf y2_1;
  v4sf z_1;
  v4sf poly_mask_1;
  v4sf sign_bit_1;
  v4si emm2;
  v4si emm0;
  v4sf y_1;
  v4sf xmm3_1;
  v4sf xmm2_1;
  v4sf xmm1_1;
  undefined8 local_1570;
  undefined8 uStack_1568;
  undefined8 local_1560;
  undefined8 uStack_1558;
  undefined8 uStack_1550;
  undefined8 uStack_1548;
  int local_153c;
  undefined8 local_1538;
  undefined8 local_1530;
  undefined8 local_1528;
  undefined4 local_1520;
  long local_1518;
  undefined4 local_1510;
  undefined4 local_150c;
  undefined4 local_1508;
  undefined4 local_1504;
  undefined4 local_1500;
  undefined8 local_14f8;
  undefined1 (*local_14f0) [32];
  int local_14e8;
  int local_14e4;
  int local_14e0;
  int local_14dc;
  int local_14d8;
  int local_14d4;
  int local_14d0;
  undefined1 local_14c9 [9];
  long *local_14c0;
  undefined1 local_14b5;
  int local_14b4;
  undefined8 *local_14a8;
  undefined8 *local_14a0;
  undefined8 *local_1490;
  undefined1 (*local_1488) [32];
  undefined8 local_1480;
  undefined8 uStack_1478;
  undefined8 uStack_1470;
  undefined8 uStack_1468;
  undefined1 (*local_1450) [32];
  undefined1 (*local_1448) [32];
  undefined8 local_1440;
  undefined8 uStack_1438;
  undefined1 (*local_1430) [32];
  long local_1428;
  undefined4 local_141c;
  long local_1418;
  undefined1 (*local_1410) [32];
  undefined4 local_1404;
  int local_1400;
  int local_13fc;
  undefined8 *local_13f8;
  undefined4 local_13ec;
  long local_13e8;
  undefined8 *local_13d8;
  undefined8 *local_13b0;
  undefined1 *local_13a8;
  undefined8 *local_13a0;
  undefined1 *local_1398;
  undefined1 (*local_1390) [32];
  undefined1 *local_1388;
  undefined1 local_1380 [8];
  undefined8 uStack_1378;
  undefined8 uStack_1370;
  undefined8 uStack_1368;
  float local_1360;
  float fStack_135c;
  float fStack_1358;
  float fStack_1354;
  float fStack_1350;
  float fStack_134c;
  float fStack_1348;
  float fStack_1344;
  undefined8 local_1340;
  undefined8 uStack_1338;
  undefined8 uStack_1330;
  undefined8 uStack_1328;
  undefined8 local_1320;
  undefined8 uStack_1318;
  undefined8 uStack_1310;
  undefined8 uStack_1308;
  undefined8 local_1300;
  undefined8 uStack_12f8;
  undefined8 uStack_12f0;
  undefined8 uStack_12e8;
  undefined8 local_12e0;
  undefined8 uStack_12d8;
  undefined8 uStack_12d0;
  undefined8 uStack_12c8;
  undefined8 local_12c0;
  undefined8 uStack_12b8;
  undefined8 uStack_12b0;
  undefined8 uStack_12a8;
  int local_12a0;
  int iStack_129c;
  int iStack_1298;
  int iStack_1294;
  int iStack_1290;
  int iStack_128c;
  int iStack_1288;
  int iStack_1284;
  undefined1 local_1280 [16];
  undefined1 local_1270 [16];
  undefined1 local_1260 [16];
  undefined1 local_1250 [16];
  undefined8 local_1240;
  undefined8 uStack_1238;
  undefined8 uStack_1230;
  undefined8 uStack_1228;
  undefined8 local_1220;
  undefined8 uStack_1218;
  undefined8 uStack_1210;
  undefined8 uStack_1208;
  undefined1 local_1200 [8];
  undefined8 uStack_11f8;
  undefined8 uStack_11f0;
  undefined8 uStack_11e8;
  undefined8 local_11e0;
  undefined8 uStack_11d8;
  undefined8 uStack_11d0;
  undefined8 uStack_11c8;
  undefined8 local_11c0;
  undefined8 uStack_11b8;
  undefined8 uStack_11b0;
  undefined8 uStack_11a8;
  undefined8 local_11a0;
  undefined8 uStack_1198;
  undefined8 uStack_1190;
  undefined8 uStack_1188;
  undefined8 local_1180;
  undefined8 uStack_1178;
  undefined8 uStack_1170;
  undefined8 uStack_1168;
  undefined8 local_1160;
  undefined8 uStack_1158;
  undefined8 uStack_1150;
  undefined8 uStack_1148;
  undefined8 local_1140;
  undefined8 uStack_1138;
  undefined8 uStack_1130;
  undefined8 uStack_1128;
  undefined8 local_1120;
  undefined8 uStack_1118;
  undefined8 uStack_1110;
  undefined8 uStack_1108;
  undefined8 local_1100;
  undefined8 uStack_10f8;
  undefined8 uStack_10f0;
  undefined8 uStack_10e8;
  undefined8 local_10e0;
  undefined8 uStack_10d8;
  undefined8 uStack_10d0;
  undefined8 uStack_10c8;
  undefined8 local_10c0;
  undefined8 uStack_10b8;
  undefined8 uStack_10b0;
  undefined8 uStack_10a8;
  undefined1 local_10a0 [32];
  undefined8 local_1080;
  undefined8 uStack_1078;
  undefined8 uStack_1070;
  undefined8 uStack_1068;
  undefined8 local_1060;
  undefined8 uStack_1058;
  undefined8 uStack_1050;
  undefined8 uStack_1048;
  undefined8 local_1040;
  undefined8 uStack_1038;
  undefined8 uStack_1030;
  undefined8 uStack_1028;
  undefined8 local_1020;
  undefined8 uStack_1018;
  undefined8 uStack_1010;
  undefined8 uStack_1008;
  undefined8 local_1000;
  undefined8 uStack_ff8;
  undefined8 uStack_ff0;
  undefined8 uStack_fe8;
  undefined8 local_fe0;
  undefined8 uStack_fd8;
  undefined8 uStack_fd0;
  undefined8 uStack_fc8;
  undefined8 local_fc0;
  undefined8 uStack_fb8;
  undefined8 uStack_fb0;
  undefined8 uStack_fa8;
  undefined8 local_fa0;
  undefined8 uStack_f98;
  undefined8 uStack_f90;
  undefined8 uStack_f88;
  undefined8 local_f80;
  undefined8 uStack_f78;
  undefined8 uStack_f70;
  undefined8 uStack_f68;
  undefined8 local_f60;
  undefined8 uStack_f58;
  undefined8 uStack_f50;
  undefined8 uStack_f48;
  undefined8 local_f40;
  undefined8 uStack_f38;
  undefined8 uStack_f30;
  undefined8 uStack_f28;
  undefined8 local_f20;
  undefined8 uStack_f18;
  undefined8 uStack_f10;
  undefined8 uStack_f08;
  undefined8 local_f00;
  undefined8 uStack_ef8;
  undefined8 uStack_ef0;
  undefined8 uStack_ee8;
  undefined8 local_ee0;
  undefined8 uStack_ed8;
  undefined8 uStack_ed0;
  undefined8 uStack_ec8;
  undefined8 local_ec0;
  undefined8 uStack_eb8;
  undefined8 uStack_eb0;
  undefined8 uStack_ea8;
  undefined8 local_ea0;
  undefined8 uStack_e98;
  undefined8 uStack_e90;
  undefined8 uStack_e88;
  float *local_e78;
  float *local_e70;
  undefined1 *local_e68;
  undefined8 local_e60;
  undefined8 uStack_e58;
  undefined8 uStack_e50;
  undefined8 uStack_e48;
  undefined8 local_e40;
  undefined8 uStack_e38;
  undefined8 uStack_e30;
  undefined8 uStack_e28;
  float *local_e18;
  float *local_e10;
  undefined1 *local_e08;
  undefined8 local_e00;
  undefined8 uStack_df8;
  undefined8 uStack_df0;
  undefined8 uStack_de8;
  undefined8 local_de0;
  undefined8 uStack_dd8;
  undefined8 uStack_dd0;
  undefined8 uStack_dc8;
  undefined8 *local_db8;
  undefined8 *local_db0;
  undefined1 *local_da8;
  undefined8 local_da0;
  undefined8 uStack_d98;
  undefined8 uStack_d90;
  undefined8 uStack_d88;
  undefined8 local_d80;
  undefined8 uStack_d78;
  undefined8 uStack_d70;
  undefined8 uStack_d68;
  undefined8 *local_d58;
  undefined8 *local_d50;
  undefined1 *local_d48;
  undefined8 local_d40;
  undefined8 uStack_d38;
  undefined8 uStack_d30;
  undefined8 uStack_d28;
  undefined8 local_d20;
  undefined8 uStack_d18;
  undefined8 uStack_d10;
  undefined8 uStack_d08;
  undefined8 *local_cf8;
  undefined8 *local_cf0;
  undefined1 *local_ce8;
  undefined8 local_ce0;
  undefined8 uStack_cd8;
  undefined8 uStack_cd0;
  undefined8 uStack_cc8;
  undefined8 local_cc0;
  undefined8 uStack_cb8;
  undefined8 uStack_cb0;
  undefined8 uStack_ca8;
  undefined1 *local_c98;
  float *local_c90;
  float *local_c88;
  float local_c80;
  float fStack_c7c;
  float fStack_c78;
  float fStack_c74;
  float fStack_c70;
  float fStack_c6c;
  float fStack_c68;
  float fStack_c64;
  undefined8 local_c60;
  undefined8 uStack_c58;
  undefined8 uStack_c50;
  undefined8 uStack_c48;
  float local_c40 [2];
  float afStack_c38 [2];
  float afStack_c30 [2];
  float afStack_c28 [2];
  undefined8 local_c20;
  undefined8 uStack_c18;
  undefined8 uStack_c10;
  undefined8 uStack_c08;
  undefined8 local_c00;
  undefined8 uStack_bf8;
  undefined8 uStack_bf0;
  undefined8 uStack_be8;
  float local_be0;
  float fStack_bdc;
  float fStack_bd8;
  float fStack_bd4;
  float fStack_bd0;
  float fStack_bcc;
  float fStack_bc8;
  undefined4 uStack_bc4;
  undefined8 local_bc0;
  undefined8 uStack_bb8;
  undefined8 uStack_bb0;
  undefined8 uStack_ba8;
  float local_ba0;
  float fStack_b9c;
  float fStack_b98;
  float fStack_b94;
  float fStack_b90;
  float fStack_b8c;
  float fStack_b88;
  undefined4 uStack_b84;
  undefined8 local_b80;
  undefined8 uStack_b78;
  undefined8 uStack_b70;
  undefined8 uStack_b68;
  float local_b60;
  float fStack_b5c;
  float fStack_b58;
  float fStack_b54;
  float fStack_b50;
  float fStack_b4c;
  float fStack_b48;
  undefined4 uStack_b44;
  float local_b40 [2];
  float afStack_b38 [2];
  float afStack_b30 [2];
  float afStack_b28 [2];
  float local_b20;
  float fStack_b1c;
  float fStack_b18;
  float fStack_b14;
  float fStack_b10;
  float fStack_b0c;
  float fStack_b08;
  float fStack_b04;
  float local_b00 [2];
  float afStack_af8 [2];
  float afStack_af0 [2];
  float afStack_ae8 [2];
  float local_ae0;
  float fStack_adc;
  float fStack_ad8;
  float fStack_ad4;
  float fStack_ad0;
  float fStack_acc;
  float fStack_ac8;
  float fStack_ac4;
  undefined8 local_ac0;
  undefined8 uStack_ab8;
  undefined8 uStack_ab0;
  undefined8 uStack_aa8;
  undefined8 local_aa0;
  undefined8 uStack_a98;
  undefined8 uStack_a90;
  undefined8 uStack_a88;
  undefined8 local_a80;
  undefined8 uStack_a78;
  undefined8 uStack_a70;
  undefined8 uStack_a68;
  undefined8 local_a60;
  undefined8 uStack_a58;
  undefined8 uStack_a50;
  undefined8 uStack_a48;
  undefined8 local_a40;
  undefined8 uStack_a38;
  undefined8 uStack_a30;
  undefined8 uStack_a28;
  undefined8 local_a20;
  undefined8 uStack_a18;
  undefined8 uStack_a10;
  undefined8 uStack_a08;
  undefined8 local_a00;
  undefined8 uStack_9f8;
  undefined8 uStack_9f0;
  undefined8 uStack_9e8;
  undefined8 local_9e0;
  undefined8 uStack_9d8;
  undefined8 uStack_9d0;
  undefined8 uStack_9c8;
  undefined8 local_9c0;
  undefined8 uStack_9b8;
  undefined8 uStack_9b0;
  undefined8 uStack_9a8;
  undefined8 local_9a0;
  undefined8 uStack_998;
  undefined8 uStack_990;
  undefined8 uStack_988;
  undefined8 local_980;
  undefined8 uStack_978;
  undefined8 uStack_970;
  undefined8 uStack_968;
  undefined8 local_960;
  undefined8 uStack_958;
  undefined8 local_950;
  undefined8 uStack_948;
  undefined8 local_940;
  undefined8 uStack_938;
  undefined8 local_930;
  undefined8 uStack_928;
  undefined4 local_914;
  undefined8 local_910;
  undefined8 uStack_908;
  undefined4 local_8f4;
  undefined8 local_8f0;
  undefined8 uStack_8e8;
  undefined8 local_8e0;
  undefined8 uStack_8d8;
  undefined8 uStack_8d0;
  undefined8 uStack_8c8;
  undefined8 local_8c0;
  undefined8 uStack_8b8;
  undefined8 local_8b0;
  undefined8 uStack_8a8;
  undefined8 local_8a0;
  undefined8 uStack_898;
  undefined8 local_890;
  undefined8 uStack_888;
  undefined8 local_880;
  undefined8 uStack_878;
  undefined8 local_870;
  undefined8 uStack_868;
  undefined8 local_860;
  undefined8 uStack_858;
  undefined8 local_850;
  undefined8 uStack_848;
  undefined8 local_840;
  undefined8 uStack_838;
  undefined8 local_830;
  undefined8 uStack_828;
  undefined8 local_820;
  undefined8 uStack_818;
  undefined8 local_810;
  undefined8 uStack_808;
  undefined8 local_800;
  ulong uStack_7f8;
  undefined8 local_7f0;
  undefined8 uStack_7e8;
  undefined8 local_7e0;
  ulong uStack_7d8;
  undefined8 local_7d0;
  undefined8 uStack_7c8;
  undefined1 local_7c0 [16];
  undefined1 local_7b0 [16];
  undefined8 local_7a0;
  undefined8 uStack_798;
  undefined8 uStack_790;
  undefined8 uStack_788;
  undefined8 local_780;
  undefined8 uStack_778;
  undefined8 uStack_770;
  undefined8 uStack_768;
  undefined8 local_760;
  undefined8 uStack_758;
  undefined8 uStack_750;
  undefined8 uStack_748;
  undefined8 local_740;
  undefined8 uStack_738;
  undefined8 uStack_730;
  undefined8 uStack_728;
  undefined8 local_720;
  undefined8 uStack_718;
  undefined8 local_710;
  undefined8 uStack_708;
  undefined8 local_700;
  undefined8 uStack_6f8;
  undefined8 local_6f0;
  undefined8 uStack_6e8;
  undefined1 local_6e0 [8];
  undefined8 uStack_6d8;
  float local_6d0;
  float fStack_6cc;
  float fStack_6c8;
  float fStack_6c4;
  undefined8 local_6c0;
  undefined8 uStack_6b8;
  undefined8 local_6b0;
  undefined8 uStack_6a8;
  undefined1 local_6a0 [16];
  undefined1 local_690 [16];
  undefined1 local_680 [8];
  undefined8 uStack_678;
  undefined8 local_670;
  undefined8 uStack_668;
  undefined8 local_660;
  undefined8 uStack_658;
  undefined8 local_650;
  undefined8 uStack_648;
  undefined8 local_640;
  undefined8 uStack_638;
  undefined8 local_630;
  undefined8 uStack_628;
  undefined8 local_620;
  undefined8 uStack_618;
  undefined8 local_610;
  undefined8 uStack_608;
  undefined8 local_600;
  undefined8 uStack_5f8;
  undefined8 local_5f0;
  undefined8 uStack_5e8;
  undefined8 local_5e0;
  undefined8 uStack_5d8;
  undefined1 local_5d0 [16];
  undefined8 local_5c0;
  undefined8 uStack_5b8;
  undefined8 local_5b0;
  undefined8 uStack_5a8;
  undefined8 local_5a0;
  undefined8 uStack_598;
  undefined8 local_590;
  undefined8 uStack_588;
  undefined8 local_580;
  undefined8 uStack_578;
  undefined8 local_570;
  undefined8 uStack_568;
  undefined8 local_560;
  undefined8 uStack_558;
  undefined8 local_550;
  undefined8 uStack_548;
  undefined8 local_540;
  undefined8 uStack_538;
  undefined8 local_530;
  undefined8 uStack_528;
  undefined8 local_520;
  undefined8 uStack_518;
  undefined8 local_510;
  undefined8 uStack_508;
  undefined4 local_4f4;
  undefined8 local_4f0;
  undefined8 uStack_4e8;
  undefined8 local_4e0;
  undefined8 uStack_4d8;
  undefined8 local_4d0;
  undefined8 uStack_4c8;
  undefined8 local_4c0;
  undefined8 uStack_4b8;
  undefined8 local_4b0;
  undefined8 uStack_4a8;
  undefined8 local_4a0;
  undefined8 uStack_498;
  undefined8 local_490;
  undefined8 uStack_488;
  undefined1 *local_478;
  float *local_470;
  float *local_468;
  float local_460;
  float fStack_45c;
  float fStack_458;
  float fStack_454;
  undefined8 local_450;
  undefined8 uStack_448;
  float local_440 [2];
  float afStack_438 [2];
  undefined8 local_430;
  undefined8 uStack_428;
  undefined8 *local_418;
  undefined8 *local_410;
  undefined1 *local_408;
  undefined8 local_400;
  undefined8 uStack_3f8;
  undefined8 local_3f0;
  undefined8 uStack_3e8;
  undefined8 local_3e0;
  undefined8 uStack_3d8;
  float local_3d0;
  float fStack_3cc;
  float fStack_3c8;
  float fStack_3c4;
  float *local_3b8;
  float *local_3b0;
  undefined1 *local_3a8;
  undefined8 local_3a0;
  undefined8 uStack_398;
  undefined8 local_390;
  undefined8 uStack_388;
  float local_380 [2];
  float afStack_378 [2];
  float local_370;
  float fStack_36c;
  float fStack_368;
  float fStack_364;
  float *local_358;
  float *local_350;
  undefined1 *local_348;
  undefined8 local_340;
  undefined8 uStack_338;
  undefined8 local_330;
  undefined8 uStack_328;
  float local_320 [2];
  float afStack_318 [2];
  float local_310;
  float fStack_30c;
  float fStack_308;
  float fStack_304;
  float *local_2f8;
  float *local_2f0;
  undefined1 *local_2e8;
  undefined8 local_2e0;
  undefined8 uStack_2d8;
  undefined8 local_2d0;
  undefined8 uStack_2c8;
  float local_2c0 [2];
  float afStack_2b8 [2];
  float local_2b0;
  float fStack_2ac;
  float fStack_2a8;
  float fStack_2a4;
  float *local_298;
  float *local_290;
  undefined1 *local_288;
  undefined8 local_280;
  undefined8 uStack_278;
  undefined8 local_270;
  undefined8 uStack_268;
  float local_260 [2];
  float afStack_258 [2];
  float local_250;
  float fStack_24c;
  float fStack_248;
  float fStack_244;
  undefined8 *local_238;
  undefined8 *local_230;
  undefined1 *local_228;
  undefined8 local_220;
  undefined8 uStack_218;
  undefined8 local_210;
  undefined8 uStack_208;
  undefined8 local_200;
  undefined8 uStack_1f8;
  float local_1f0;
  float fStack_1ec;
  float fStack_1e8;
  float fStack_1e4;
  undefined8 *local_1d8;
  undefined8 *local_1d0;
  undefined1 *local_1c8;
  undefined8 local_1c0;
  undefined8 uStack_1b8;
  undefined8 local_1b0;
  undefined8 uStack_1a8;
  undefined8 local_1a0;
  undefined8 uStack_198;
  float local_190;
  float fStack_18c;
  float fStack_188;
  float fStack_184;
  undefined8 *local_178;
  undefined8 *local_170;
  undefined1 *local_168;
  undefined8 local_160;
  undefined8 uStack_158;
  undefined8 local_150;
  undefined8 uStack_148;
  undefined8 local_140;
  undefined8 uStack_138;
  float local_130;
  float fStack_12c;
  float fStack_128;
  float fStack_124;
  undefined8 local_120;
  undefined8 uStack_118;
  undefined8 local_110;
  undefined8 uStack_108;
  undefined8 local_100;
  undefined8 uStack_f8;
  undefined8 local_f0;
  undefined8 uStack_e8;
  undefined8 local_e0;
  undefined8 uStack_d8;
  undefined8 local_d0;
  undefined8 uStack_c8;
  undefined8 local_c0;
  ulong uStack_b8;
  undefined8 local_b0;
  undefined8 uStack_a8;
  undefined1 local_a0 [16];
  undefined8 local_90;
  undefined8 uStack_88;
  undefined8 local_80;
  undefined8 uStack_78;
  undefined8 local_70;
  undefined8 uStack_68;
  undefined1 local_60 [16];
  undefined8 local_50;
  undefined8 uStack_48;
  undefined8 local_40;
  undefined8 uStack_38;
  
  local_14d0 = *(int *)((long)in_RDI + 0x2c);
  local_14d4 = (int)in_RDI[6];
  local_14d8 = *(int *)((long)in_RDI + 0x34);
  local_14dc = (int)in_RDI[7];
  local_14e0 = (int)in_RDI[3];
  local_14e4 = local_14d0 * local_14d4 * local_14d8 * local_14e0;
  local_14c0 = in_RDI;
  for (local_14e8 = 0; local_14e8 < local_14dc; local_14e8 = local_14e8 + 1) {
    local_14a8 = &local_1538;
    local_13fc = *(int *)((long)local_14c0 + 0x2c);
    local_1400 = (int)local_14c0[6];
    local_1404 = *(undefined4 *)((long)local_14c0 + 0x34);
    local_1410 = (undefined1 (*) [32])
                 (*local_14c0 + local_14c0[8] * (long)local_14e8 * local_14c0[2]);
    local_1418 = local_14c0[2];
    local_141c = (undefined4)local_14c0[3];
    local_1428 = local_14c0[4];
    local_13f8 = &local_1538;
    local_13e8 = (long)local_13fc * (long)local_1400 * local_1418;
    local_14a0 = &local_1538;
    local_1490 = &local_1538;
    local_13ec = 0x10;
    local_14b4 = local_14e8;
    local_14b5 = 1;
    local_1538 = 0;
    local_1528 = 0;
    local_1520 = 0;
    local_1510 = 0;
    local_150c = 0;
    local_1508 = 0;
    local_1504 = 0;
    local_1500 = 0;
    local_14f8 = 0;
    local_1530 = 0;
    local_14f0 = local_1410;
    for (local_153c = 0; local_153c + 7 < local_14e4; local_153c = local_153c + 8) {
      local_1488 = local_14f0;
      uStack_10b0 = *(undefined8 *)(*local_14f0 + 0x10);
      uStack_10a8 = *(undefined8 *)(*local_14f0 + 0x18);
      local_13a8 = local_14c9;
      local_13b0 = &local_1560;
      local_10a0 = ZEXT832(0) << 0x20;
      local_1180 = SUB168(*(undefined1 (*) [16])*local_14f0,0);
      local_10c0 = local_1180;
      uStack_1178 = SUB168(*(undefined1 (*) [16])*local_14f0,8);
      uStack_10b8 = uStack_1178;
      local_10e0 = 0x7fffffff7fffffff;
      uStack_10d8 = 0x7fffffff7fffffff;
      uStack_10d0 = 0x7fffffff7fffffff;
      uStack_10c8 = 0x7fffffff7fffffff;
      auVar24._8_8_ = 0x7fffffff7fffffff;
      auVar24._0_8_ = 0x7fffffff7fffffff;
      auVar24._16_8_ = 0x7fffffff7fffffff;
      auVar24._24_8_ = 0x7fffffff7fffffff;
      auVar1 = vandps_avx(*local_14f0,auVar24);
      local_1180 = auVar1._0_8_;
      uVar6 = local_1180;
      uStack_1178 = auVar1._8_8_;
      uVar7 = uStack_1178;
      uStack_1170 = auVar1._16_8_;
      uVar8 = uStack_1170;
      uStack_1168 = auVar1._24_8_;
      uVar9 = uStack_1168;
      local_ec0 = 0x3fa2f9833fa2f983;
      uStack_eb8 = 0x3fa2f9833fa2f983;
      uStack_eb0 = 0x3fa2f9833fa2f983;
      uStack_ea8 = 0x3fa2f9833fa2f983;
      local_ea0._0_4_ = auVar1._0_4_;
      local_ea0._4_4_ = auVar1._4_4_;
      uStack_e98._0_4_ = auVar1._8_4_;
      uStack_e98._4_4_ = auVar1._12_4_;
      uStack_e90._0_4_ = auVar1._16_4_;
      uStack_e90._4_4_ = auVar1._20_4_;
      uStack_e88._0_4_ = auVar1._24_4_;
      uStack_e88._4_4_ = auVar1._28_4_;
      local_1200._4_4_ = local_ea0._4_4_ * 1.2732395;
      local_1200._0_4_ = (float)local_ea0 * 1.2732395;
      uStack_11f8._0_4_ = (float)uStack_e98 * 1.2732395;
      uStack_11f8._4_4_ = uStack_e98._4_4_ * 1.2732395;
      uStack_11f0._0_4_ = (float)uStack_e90 * 1.2732395;
      uStack_11f0._4_4_ = uStack_e90._4_4_ * 1.2732395;
      auVar50 = _local_1200;
      uStack_11e8._0_4_ = (float)uStack_e88 * 1.2732395;
      uStack_11e8._4_4_ = uStack_e88._4_4_;
      auVar1 = _local_1200;
      local_980 = local_1200;
      uStack_978 = uStack_11f8;
      uStack_11f0 = auVar50._16_8_;
      uStack_970 = uStack_11f0;
      uStack_11e8 = auVar1._24_8_;
      uStack_968 = uStack_11e8;
      local_12a0 = (int)((float)local_ea0 * 1.2732395);
      iStack_129c = (int)(local_ea0._4_4_ * 1.2732395);
      iStack_1298 = (int)((float)uStack_e98 * 1.2732395);
      iStack_1294 = (int)(uStack_e98._4_4_ * 1.2732395);
      iStack_1290 = (int)((float)uStack_e90 * 1.2732395);
      iStack_128c = (int)(uStack_e90._4_4_ * 1.2732395);
      iStack_1288 = (int)((float)uStack_e88 * 1.2732395);
      iStack_1284 = (int)uStack_e88._4_4_;
      local_930 = CONCAT44(iStack_129c,local_12a0);
      uStack_928 = CONCAT44(iStack_1294,iStack_1298);
      local_950 = CONCAT44(iStack_128c,iStack_1290);
      uStack_948 = CONCAT44(iStack_1284,iStack_1288);
      local_960 = 0x100000001;
      uStack_958 = 0x100000001;
      auVar5._8_8_ = uStack_928;
      auVar5._0_8_ = local_930;
      auVar2._8_8_ = 0x100000001;
      auVar2._0_8_ = 0x100000001;
      auVar2 = vpaddd_avx(auVar5,auVar2);
      auVar4._8_8_ = uStack_948;
      auVar4._0_8_ = local_950;
      auVar3._8_8_ = 0x100000001;
      auVar3._0_8_ = 0x100000001;
      auVar3 = vpaddd_avx(auVar4,auVar3);
      local_1270._0_8_ = auVar2._0_8_;
      local_810 = local_1270._0_8_;
      local_1270._8_8_ = auVar2._8_8_;
      uStack_808 = local_1270._8_8_;
      local_840 = 0xfffffffefffffffe;
      uStack_838 = 0xfffffffefffffffe;
      auVar32._8_8_ = 0xfffffffefffffffe;
      auVar32._0_8_ = 0xfffffffefffffffe;
      auVar2 = vpand_avx(auVar2,auVar32);
      local_1280._0_8_ = auVar3._0_8_;
      local_830 = local_1280._0_8_;
      local_1280._8_8_ = auVar3._8_8_;
      uStack_828 = local_1280._8_8_;
      auVar31._8_8_ = 0xfffffffefffffffe;
      auVar31._0_8_ = 0xfffffffefffffffe;
      auVar3 = vpand_avx(auVar3,auVar31);
      local_1270._0_8_ = auVar2._0_8_;
      local_12c0 = local_1270._0_8_;
      local_1270._8_8_ = auVar2._8_8_;
      uStack_12b8 = local_1270._8_8_;
      local_1280._0_8_ = auVar3._0_8_;
      uStack_12b0 = local_1280._0_8_;
      local_1280._8_8_ = auVar3._8_8_;
      uStack_12a8 = local_1280._8_8_;
      local_8e0 = local_1270._0_8_;
      uStack_8d8 = local_1270._8_8_;
      uStack_8d0 = local_1280._0_8_;
      uStack_8c8 = local_1280._8_8_;
      auVar26._16_8_ = local_1280._0_8_;
      auVar26._0_16_ = auVar2;
      auVar26._24_8_ = local_1280._8_8_;
      auVar1 = vcvtdq2ps_avx(auVar26);
      local_890 = local_1270._0_8_;
      uStack_888 = local_1270._8_8_;
      local_8c0 = 0x200000002;
      uStack_8b8 = 0x200000002;
      auVar28._8_8_ = 0x200000002;
      auVar28._0_8_ = 0x200000002;
      auVar4 = vpsubd_avx(auVar2,auVar28);
      local_8b0 = local_1280._0_8_;
      uStack_8a8 = local_1280._8_8_;
      auVar27._8_8_ = 0x200000002;
      auVar27._0_8_ = 0x200000002;
      auVar5 = vpsubd_avx(auVar3,auVar27);
      local_1270._0_8_ = auVar4._0_8_;
      local_6f0 = local_1270._0_8_;
      local_1270._8_8_ = auVar4._8_8_;
      uStack_6e8 = local_1270._8_8_;
      local_720 = 0x400000004;
      uStack_718 = 0x400000004;
      auVar35._8_8_ = 0x400000004;
      auVar35._0_8_ = 0x400000004;
      auVar2 = vpandn_avx(auVar4,auVar35);
      local_1280._0_8_ = auVar5._0_8_;
      local_710 = local_1280._0_8_;
      local_1280._8_8_ = auVar5._8_8_;
      uStack_708 = local_1280._8_8_;
      auVar34._8_8_ = 0x400000004;
      auVar34._0_8_ = 0x400000004;
      auVar3 = vpandn_avx(auVar5,auVar34);
      local_1250._0_8_ = auVar2._0_8_;
      local_8f0 = local_1250._0_8_;
      local_1250._8_8_ = auVar2._8_8_;
      uStack_8e8 = local_1250._8_8_;
      local_8f4 = 0x1d;
      local_1250 = vpslld_avx(auVar2,ZEXT416(0x1d));
      local_1260._0_8_ = auVar3._0_8_;
      local_910 = local_1260._0_8_;
      local_1260._8_8_ = auVar3._8_8_;
      uStack_908 = local_1260._8_8_;
      local_914 = 0x1d;
      local_1260 = vpslld_avx(auVar3,ZEXT416(0x1d));
      local_12e0 = local_1250._0_8_;
      uStack_12d8 = local_1250._8_8_;
      uStack_12d0 = local_1260._0_8_;
      uStack_12c8 = local_1260._8_8_;
      local_1220 = local_1250._0_8_;
      uStack_1218 = local_1250._8_8_;
      uStack_1210 = local_1260._0_8_;
      uStack_1208 = local_1260._8_8_;
      local_850 = local_1270._0_8_;
      uStack_848 = local_1270._8_8_;
      auVar30._8_8_ = 0x200000002;
      auVar30._0_8_ = 0x200000002;
      auVar2 = vpand_avx(auVar4,auVar30);
      local_870 = local_1280._0_8_;
      uStack_868 = local_1280._8_8_;
      auVar29._8_8_ = 0x200000002;
      auVar29._0_8_ = 0x200000002;
      auVar3 = vpand_avx(auVar5,auVar29);
      local_1270._0_8_ = auVar2._0_8_;
      local_7d0 = local_1270._0_8_;
      local_1270._8_8_ = auVar2._8_8_;
      uStack_7c8 = local_1270._8_8_;
      local_7c0 = ZEXT816(0) << 0x20;
      local_7e0 = 0;
      local_7b0._8_8_ = SUB168(ZEXT816(0),4);
      uStack_7d8 = local_7b0._8_8_;
      auVar47._8_8_ = 0;
      auVar47._0_8_ = local_7b0._8_8_;
      local_1270 = vpcmpeqd_avx(auVar2,auVar47 << 0x40);
      local_1280._0_8_ = auVar3._0_8_;
      local_7f0 = local_1280._0_8_;
      local_1280._8_8_ = auVar3._8_8_;
      uStack_7e8 = local_1280._8_8_;
      local_800 = 0;
      uStack_7f8 = local_7b0._8_8_;
      auVar48._8_8_ = 0;
      auVar48._0_8_ = local_7b0._8_8_;
      local_1280 = vpcmpeqd_avx(auVar3,auVar48 << 0x40);
      local_1300 = local_1270._0_8_;
      uStack_12f8 = local_1270._8_8_;
      uStack_12f0 = local_1280._0_8_;
      uStack_12e8 = local_1280._8_8_;
      local_1240 = local_1270._0_8_;
      uStack_1238 = local_1270._8_8_;
      uStack_1230 = local_1280._0_8_;
      uStack_1228 = local_1280._8_8_;
      local_1140 = local_1250._0_8_;
      uStack_1138 = local_1250._8_8_;
      uStack_1130 = local_1260._0_8_;
      uStack_1128 = local_1260._8_8_;
      local_1320 = local_1250._0_8_;
      uStack_1318 = local_1250._8_8_;
      uStack_1310 = local_1260._0_8_;
      uStack_1308 = local_1260._8_8_;
      local_1160 = local_1270._0_8_;
      uStack_1158 = local_1270._8_8_;
      uStack_1150 = local_1280._0_8_;
      uStack_1148 = local_1280._8_8_;
      local_1340 = local_1270._0_8_;
      uStack_1338 = local_1270._8_8_;
      uStack_1330 = local_1280._0_8_;
      uStack_1328 = local_1280._8_8_;
      local_11a0 = 0xbf490000bf490000;
      uStack_1198 = 0xbf490000bf490000;
      uStack_1190 = 0xbf490000bf490000;
      uStack_1188 = 0xbf490000bf490000;
      local_11c0 = 0xb97da000b97da000;
      uStack_11b8 = 0xb97da000b97da000;
      uStack_11b0 = 0xb97da000b97da000;
      uStack_11a8 = 0xb97da000b97da000;
      local_e68 = local_1200;
      local_cf0 = &local_11a0;
      local_db8 = &local_1180;
      local_1200 = auVar1._0_8_;
      uVar10 = local_1200;
      uStack_11f8 = auVar1._8_8_;
      uVar11 = uStack_11f8;
      uStack_11f0 = auVar1._16_8_;
      uVar12 = uStack_11f0;
      uStack_11e8 = auVar1._24_8_;
      uVar13 = uStack_11e8;
      local_ce0 = 0xbf490000bf490000;
      uStack_cd8 = 0xbf490000bf490000;
      uStack_cd0 = 0xbf490000bf490000;
      uStack_cc8 = 0xbf490000bf490000;
      local_cc0._0_4_ = auVar1._0_4_;
      local_cc0._4_4_ = auVar1._4_4_;
      uStack_cb8._0_4_ = auVar1._8_4_;
      uStack_cb8._4_4_ = auVar1._12_4_;
      uStack_cb0._0_4_ = auVar1._16_4_;
      uStack_cb0._4_4_ = auVar1._20_4_;
      uStack_ca8._0_4_ = auVar1._24_4_;
      uStack_bc4 = 0xbf490000;
      local_be0 = (float)local_cc0 * -0.78515625;
      fStack_bdc = local_cc0._4_4_ * -0.78515625;
      fStack_bd8 = (float)uStack_cb8 * -0.78515625;
      fStack_bd4 = uStack_cb8._4_4_ * -0.78515625;
      fStack_bd0 = (float)uStack_cb0 * -0.78515625;
      fStack_bcc = uStack_cb0._4_4_ * -0.78515625;
      fStack_bc8 = (float)uStack_ca8 * -0.78515625;
      local_c00 = local_1180;
      uStack_bf8 = uStack_1178;
      uStack_bf0 = uStack_1170;
      uStack_be8 = uStack_1168;
      local_1180 = CONCAT44(fStack_bdc + local_ea0._4_4_,local_be0 + (float)local_ea0);
      uStack_1178._0_4_ = fStack_bd8 + (float)uStack_e98;
      uStack_1178._4_4_ = fStack_bd4 + uStack_e98._4_4_;
      uStack_1170._0_4_ = fStack_bd0 + (float)uStack_e90;
      uStack_1170._4_4_ = fStack_bcc + uStack_e90._4_4_;
      auVar50 = _local_1180;
      uStack_1168._0_4_ = fStack_bc8 + (float)uStack_e88;
      uStack_1168._4_4_ = uStack_e88._4_4_ + -0.78515625;
      auVar1 = _local_1180;
      local_d50 = &local_11c0;
      local_d20 = local_1200;
      uStack_d18 = uStack_11f8;
      uStack_d10 = uStack_11f0;
      uStack_d08 = uStack_11e8;
      local_d40 = 0xb97da000b97da000;
      uStack_d38 = 0xb97da000b97da000;
      uStack_d30 = 0xb97da000b97da000;
      uStack_d28 = 0xb97da000b97da000;
      uStack_b84 = 0xb97da000;
      local_ba0 = (float)local_cc0 * -0.00024187565;
      fStack_b9c = local_cc0._4_4_ * -0.00024187565;
      fStack_b98 = (float)uStack_cb8 * -0.00024187565;
      fStack_b94 = uStack_cb8._4_4_ * -0.00024187565;
      fStack_b90 = (float)uStack_cb0 * -0.00024187565;
      fStack_b8c = uStack_cb0._4_4_ * -0.00024187565;
      fStack_b88 = (float)uStack_ca8 * -0.00024187565;
      local_bc0 = local_1180;
      uStack_bb8 = uStack_1178;
      uStack_1170 = auVar50._16_8_;
      uStack_bb0 = uStack_1170;
      uStack_1168 = auVar1._24_8_;
      uStack_ba8 = uStack_1168;
      fVar52 = local_ba0 + local_be0 + (float)local_ea0;
      fVar54 = fStack_b9c + fStack_bdc + local_ea0._4_4_;
      fVar55 = fStack_b98 + fStack_bd8 + (float)uStack_e98;
      fVar57 = fStack_b94 + fStack_bd4 + uStack_e98._4_4_;
      fVar59 = fStack_b90 + fStack_bd0 + (float)uStack_e90;
      fVar61 = fStack_b8c + fStack_bcc + uStack_e90._4_4_;
      fVar63 = fStack_b88 + fStack_bc8 + (float)uStack_e88;
      fStack_1344 = uStack_e88._4_4_ + -0.78515625 + -0.00024187565;
      local_1180 = CONCAT44(fVar54,fVar52);
      uStack_1178._0_4_ = fVar55;
      uStack_1178._4_4_ = fVar57;
      uStack_1170._0_4_ = fVar59;
      uStack_1170._4_4_ = fVar61;
      auVar50 = _local_1180;
      uStack_1168._0_4_ = fVar63;
      uStack_1168._4_4_ = fStack_1344;
      auVar1 = _local_1180;
      local_db0 = &local_11e0;
      local_d80 = local_1200;
      uStack_d78 = uStack_11f8;
      uStack_d70 = uStack_11f0;
      uStack_d68 = uStack_11e8;
      local_da0 = 0xb3222169b3222169;
      uStack_d98 = 0xb3222169b3222169;
      uStack_d90 = 0xb3222169b3222169;
      uStack_d88 = 0xb3222169b3222169;
      uStack_b44 = 0xb3222169;
      local_b60 = (float)local_cc0 * -3.774895e-08;
      fStack_b5c = local_cc0._4_4_ * -3.774895e-08;
      fStack_b58 = (float)uStack_cb8 * -3.774895e-08;
      fStack_b54 = uStack_cb8._4_4_ * -3.774895e-08;
      fStack_b50 = (float)uStack_cb0 * -3.774895e-08;
      fStack_b4c = uStack_cb0._4_4_ * -3.774895e-08;
      fStack_b48 = (float)uStack_ca8 * -3.774895e-08;
      local_b80 = local_1180;
      uStack_b78 = uStack_1178;
      uStack_1170 = auVar50._16_8_;
      uStack_b70 = uStack_1170;
      uStack_1168 = auVar1._24_8_;
      uStack_b68 = uStack_1168;
      fVar52 = local_b60 + fVar52;
      fVar54 = fStack_b5c + fVar54;
      fVar55 = fStack_b58 + fVar55;
      fVar57 = fStack_b54 + fVar57;
      fVar59 = fStack_b50 + fVar59;
      fVar61 = fStack_b4c + fVar61;
      fVar63 = fStack_b48 + fVar63;
      fStack_1344 = fStack_1344 + -3.774895e-08;
      local_1180 = CONCAT44(fVar54,fVar52);
      uStack_1178._0_4_ = fVar55;
      uStack_1178._4_4_ = fVar57;
      uStack_1170._0_4_ = fVar59;
      uStack_1170._4_4_ = fVar61;
      auVar50 = _local_1180;
      uStack_1168._0_4_ = fVar63;
      uStack_1168._4_4_ = fStack_1344;
      auVar26 = _local_1180;
      local_f00 = local_1180;
      uStack_ef8 = uStack_1178;
      uStack_1170 = auVar50._16_8_;
      uStack_ef0 = uStack_1170;
      uStack_1168 = auVar26._24_8_;
      uStack_ee8 = uStack_1168;
      local_1360 = fVar52 * fVar52;
      fStack_135c = fVar54 * fVar54;
      fStack_1358 = fVar55 * fVar55;
      fStack_1354 = fVar57 * fVar57;
      fStack_1350 = fVar59 * fVar59;
      fStack_134c = fVar61 * fVar61;
      fStack_1348 = fVar63 * fVar63;
      local_e70 = &local_1360;
      local_e18 = _ps256_coscof_p1;
      local_de0 = 0x37ccf5ce37ccf5ce;
      uStack_dd8 = 0x37ccf5ce37ccf5ce;
      uStack_dd0 = 0x37ccf5ce37ccf5ce;
      uStack_dc8 = 0x37ccf5ce37ccf5ce;
      local_e00 = CONCAT44(fStack_135c,local_1360);
      uStack_df8 = CONCAT44(fStack_1354,fStack_1358);
      uStack_df0 = CONCAT44(fStack_134c,fStack_1350);
      uStack_de8 = CONCAT44(fStack_1344,fStack_1348);
      local_b20 = local_1360 * 2.4433157e-05;
      fStack_b1c = fStack_135c * 2.4433157e-05;
      fStack_b18 = fStack_1358 * 2.4433157e-05;
      fStack_b14 = fStack_1354 * 2.4433157e-05;
      fStack_b10 = fStack_1350 * 2.4433157e-05;
      fStack_b0c = fStack_134c * 2.4433157e-05;
      fStack_b08 = fStack_1348 * 2.4433157e-05;
      local_b40[0] = -0.0013887316;
      local_b40[1] = -0.0013887316;
      afStack_b38[0] = -0.0013887316;
      afStack_b38[1] = -0.0013887316;
      afStack_b30[0] = -0.0013887316;
      afStack_b30[1] = -0.0013887316;
      afStack_b28[0] = -0.0013887316;
      afStack_b28[1] = -0.0013887316;
      local_1200._4_4_ = fStack_b1c + -0.0013887316;
      local_1200._0_4_ = local_b20 + -0.0013887316;
      uStack_11f8._0_4_ = fStack_b18 + -0.0013887316;
      uStack_11f8._4_4_ = fStack_b14 + -0.0013887316;
      uStack_11f0._0_4_ = fStack_b10 + -0.0013887316;
      uStack_11f0._4_4_ = fStack_b0c + -0.0013887316;
      auVar50 = _local_1200;
      uStack_11e8._0_4_ = fStack_b08 + -0.0013887316;
      uStack_11e8._4_4_ = fStack_1344 + -0.0013887316;
      auVar1 = _local_1200;
      local_e78 = _ps256_coscof_p2;
      local_e40 = local_1200;
      uStack_e38 = uStack_11f8;
      uStack_11f0 = auVar50._16_8_;
      uStack_e30 = uStack_11f0;
      uStack_11e8 = auVar1._24_8_;
      uStack_e28 = uStack_11e8;
      local_e60 = CONCAT44(fStack_135c,local_1360);
      uStack_e58 = CONCAT44(fStack_1354,fStack_1358);
      uStack_e50 = CONCAT44(fStack_134c,fStack_1350);
      uStack_e48 = CONCAT44(fStack_1344,fStack_1348);
      local_ae0 = (local_b20 + -0.0013887316) * local_1360;
      fStack_adc = (fStack_b1c + -0.0013887316) * fStack_135c;
      fStack_ad8 = (fStack_b18 + -0.0013887316) * fStack_1358;
      fStack_ad4 = (fStack_b14 + -0.0013887316) * fStack_1354;
      fStack_ad0 = (fStack_b10 + -0.0013887316) * fStack_1350;
      fStack_acc = (fStack_b0c + -0.0013887316) * fStack_134c;
      fStack_ac8 = (fStack_b08 + -0.0013887316) * fStack_1348;
      local_b00[0] = 0.041666646;
      local_b00[1] = 0.041666646;
      afStack_af8[0] = 0.041666646;
      afStack_af8[1] = 0.041666646;
      afStack_af0[0] = 0.041666646;
      afStack_af0[1] = 0.041666646;
      afStack_ae8[0] = 0.041666646;
      afStack_ae8[1] = 0.041666646;
      fVar65 = fStack_1344 + 0.041666646;
      local_1200._4_4_ = fStack_adc + 0.041666646;
      local_1200._0_4_ = local_ae0 + 0.041666646;
      uStack_11f8._0_4_ = fStack_ad8 + 0.041666646;
      uStack_11f8._4_4_ = fStack_ad4 + 0.041666646;
      uStack_11f0._0_4_ = fStack_ad0 + 0.041666646;
      uStack_11f0._4_4_ = fStack_acc + 0.041666646;
      auVar50 = _local_1200;
      uStack_11e8._0_4_ = fStack_ac8 + 0.041666646;
      uStack_11e8._4_4_ = fVar65;
      auVar1 = _local_1200;
      local_f20 = local_1200;
      uStack_f18 = uStack_11f8;
      uStack_11f0 = auVar50._16_8_;
      uStack_f10 = uStack_11f0;
      uStack_11e8 = auVar1._24_8_;
      uStack_f08 = uStack_11e8;
      local_f40 = CONCAT44(fStack_135c,local_1360);
      uStack_f38 = CONCAT44(fStack_1354,fStack_1358);
      uStack_f30 = CONCAT44(fStack_134c,fStack_1350);
      uStack_f28 = CONCAT44(fStack_1344,fStack_1348);
      local_1200._0_4_ = (local_ae0 + 0.041666646) * local_1360;
      local_1200._4_4_ = (fStack_adc + 0.041666646) * fStack_135c;
      fVar56 = (fStack_ad8 + 0.041666646) * fStack_1358;
      fVar58 = (fStack_ad4 + 0.041666646) * fStack_1354;
      fVar60 = (fStack_ad0 + 0.041666646) * fStack_1350;
      fVar62 = (fStack_acc + 0.041666646) * fStack_134c;
      fVar64 = (fStack_ac8 + 0.041666646) * fStack_1348;
      uStack_11f8._0_4_ = fVar56;
      uStack_11f8._4_4_ = fVar58;
      uStack_11f0._0_4_ = fVar60;
      uStack_11f0._4_4_ = fVar62;
      auVar50 = _local_1200;
      uStack_11e8._0_4_ = fVar64;
      auVar1 = _local_1200;
      local_f60 = local_1200;
      uStack_f58 = uStack_11f8;
      uStack_11f0 = auVar50._16_8_;
      uStack_f50 = uStack_11f0;
      uStack_11e8 = auVar1._24_8_;
      uStack_f48 = uStack_11e8;
      local_f80 = CONCAT44(fStack_135c,local_1360);
      uStack_f78 = CONCAT44(fStack_1354,fStack_1358);
      uStack_f70 = CONCAT44(fStack_134c,fStack_1350);
      uStack_f68 = CONCAT44(fStack_1344,fStack_1348);
      local_1200._4_4_ = (float)local_1200._4_4_ * fStack_135c;
      local_1200._0_4_ = (float)local_1200._0_4_ * local_1360;
      uStack_11f8._0_4_ = fVar56 * fStack_1358;
      uStack_11f8._4_4_ = fVar58 * fStack_1354;
      uStack_11f0._0_4_ = fVar60 * fStack_1350;
      uStack_11f0._4_4_ = fVar62 * fStack_134c;
      auVar50 = _local_1200;
      uStack_11e8._0_4_ = fVar64 * fStack_1348;
      auVar1 = _local_1200;
      local_c90 = ::_ps256_0p5;
      local_c60 = local_1200;
      uStack_c58 = uStack_11f8;
      uStack_11f0 = auVar50._16_8_;
      uStack_c50 = uStack_11f0;
      uStack_11e8 = auVar1._24_8_;
      uStack_c48 = uStack_11e8;
      local_c20 = CONCAT44(fStack_135c,local_1360);
      uStack_c18 = CONCAT44(fStack_1354,fStack_1358);
      uStack_c10 = CONCAT44(fStack_134c,fStack_1350);
      uStack_c08 = CONCAT44(fStack_1344,fStack_1348);
      local_c40[0] = 0.5;
      local_c40[1] = 0.5;
      afStack_c38[0] = 0.5;
      afStack_c38[1] = 0.5;
      afStack_c30[0] = 0.5;
      afStack_c30[1] = 0.5;
      afStack_c28[0] = 0.5;
      afStack_c28[1] = 0.5;
      local_c80 = local_1360 * 0.5;
      fStack_c7c = fStack_135c * 0.5;
      fStack_c78 = fStack_1358 * 0.5;
      fStack_c74 = fStack_1354 * 0.5;
      fStack_c70 = fStack_1350 * 0.5;
      fStack_c6c = fStack_134c * 0.5;
      fStack_c68 = fStack_1348 * 0.5;
      auVar25._4_4_ = fStack_c7c;
      auVar25._0_4_ = local_c80;
      auVar25._8_4_ = fStack_c78;
      auVar25._12_4_ = fStack_c74;
      auVar25._16_4_ = fStack_c70;
      auVar25._20_4_ = fStack_c6c;
      auVar25._24_4_ = fStack_c68;
      auVar25._28_4_ = fStack_1344;
      auVar1 = vsubps_avx(auVar1,auVar25);
      local_1200 = auVar1._0_8_;
      uVar14 = local_1200;
      uStack_11f8 = auVar1._8_8_;
      uVar15 = uStack_11f8;
      uStack_11f0 = auVar1._16_8_;
      uVar16 = uStack_11f0;
      uStack_11e8 = auVar1._24_8_;
      uVar17 = uStack_11e8;
      local_9c0 = 0x3f8000003f800000;
      uStack_9b8 = 0x3f8000003f800000;
      uStack_9b0 = 0x3f8000003f800000;
      uStack_9a8 = 0x3f8000003f800000;
      local_9a0._0_4_ = auVar1._0_4_;
      local_9a0._4_4_ = auVar1._4_4_;
      uStack_998._0_4_ = auVar1._8_4_;
      uStack_998._4_4_ = auVar1._12_4_;
      uStack_990._0_4_ = auVar1._16_4_;
      uStack_990._4_4_ = auVar1._20_4_;
      uStack_988._0_4_ = auVar1._24_4_;
      uStack_988._4_4_ = auVar1._28_4_;
      local_1200._4_4_ = local_9a0._4_4_ + 1.0;
      local_1200._0_4_ = (float)local_9a0 + 1.0;
      uStack_11f8._0_4_ = (float)uStack_998 + 1.0;
      uStack_11f8._4_4_ = uStack_998._4_4_ + 1.0;
      uStack_11f0._0_4_ = (float)uStack_990 + 1.0;
      uStack_11f0._4_4_ = uStack_990._4_4_ + 1.0;
      auVar51 = _local_1200;
      uStack_11e8._0_4_ = (float)uStack_988 + 1.0;
      uStack_11e8._4_4_ = uStack_988._4_4_ + 1.0;
      auVar24 = _local_1200;
      local_fa0 = 0xb94ca1f9b94ca1f9;
      uStack_f98 = 0xb94ca1f9b94ca1f9;
      uStack_f90 = 0xb94ca1f9b94ca1f9;
      uStack_f88 = 0xb94ca1f9b94ca1f9;
      local_fc0 = CONCAT44(fStack_135c,local_1360);
      uStack_fb8 = CONCAT44(fStack_1354,fStack_1358);
      uStack_fb0 = CONCAT44(fStack_134c,fStack_1350);
      uStack_fa8 = CONCAT44(fStack_1344,fStack_1348);
      local_1380._4_4_ = fStack_135c * -0.00019515296;
      local_1380._0_4_ = local_1360 * -0.00019515296;
      uStack_1378._0_4_ = fStack_1358 * -0.00019515296;
      uStack_1378._4_4_ = fStack_1354 * -0.00019515296;
      uStack_1370._0_4_ = fStack_1350 * -0.00019515296;
      uStack_1370._4_4_ = fStack_134c * -0.00019515296;
      auVar50 = _local_1380;
      uStack_1368._0_4_ = fStack_1348 * -0.00019515296;
      uStack_1368._4_4_ = 0xb94ca1f9;
      auVar1 = _local_1380;
      local_9e0 = local_1380;
      uStack_9d8 = uStack_1378;
      uStack_1370 = auVar50._16_8_;
      uStack_9d0 = uStack_1370;
      uStack_1368 = auVar1._24_8_;
      uStack_9c8 = uStack_1368;
      local_a00 = 0x3c08839e3c08839e;
      uStack_9f8 = 0x3c08839e3c08839e;
      uStack_9f0 = 0x3c08839e3c08839e;
      uStack_9e8 = 0x3c08839e3c08839e;
      local_1380._0_4_ = local_1360 * -0.00019515296 + 0.008332161;
      local_1380._4_4_ = fStack_135c * -0.00019515296 + 0.008332161;
      fVar56 = fStack_1358 * -0.00019515296 + 0.008332161;
      fVar58 = fStack_1354 * -0.00019515296 + 0.008332161;
      fVar60 = fStack_1350 * -0.00019515296 + 0.008332161;
      fVar62 = fStack_134c * -0.00019515296 + 0.008332161;
      fVar64 = fStack_1348 * -0.00019515296 + 0.008332161;
      uStack_1378._0_4_ = fVar56;
      uStack_1378._4_4_ = fVar58;
      uStack_1370._0_4_ = fVar60;
      uStack_1370._4_4_ = fVar62;
      auVar50 = _local_1380;
      uStack_1368._0_4_ = fVar64;
      uStack_1368._4_4_ = 0x3c055116;
      auVar1 = _local_1380;
      local_fe0 = local_1380;
      uStack_fd8 = uStack_1378;
      uStack_1370 = auVar50._16_8_;
      uStack_fd0 = uStack_1370;
      uStack_1368 = auVar1._24_8_;
      uStack_fc8 = uStack_1368;
      local_1000 = CONCAT44(fStack_135c,local_1360);
      uStack_ff8 = CONCAT44(fStack_1354,fStack_1358);
      uStack_ff0 = CONCAT44(fStack_134c,fStack_1350);
      uStack_fe8 = CONCAT44(fStack_1344,fStack_1348);
      local_1380._0_4_ = (float)local_1380._0_4_ * local_1360;
      local_1380._4_4_ = (float)local_1380._4_4_ * fStack_135c;
      fVar56 = fVar56 * fStack_1358;
      fVar58 = fVar58 * fStack_1354;
      fVar60 = fVar60 * fStack_1350;
      fVar62 = fVar62 * fStack_134c;
      fVar64 = fVar64 * fStack_1348;
      uStack_1378._0_4_ = fVar56;
      uStack_1378._4_4_ = fVar58;
      uStack_1370._0_4_ = fVar60;
      uStack_1370._4_4_ = fVar62;
      auVar50 = _local_1380;
      uStack_1368._0_4_ = fVar64;
      uStack_1368._4_4_ = 0x3c055116;
      auVar1 = _local_1380;
      local_a20 = local_1380;
      uStack_a18 = uStack_1378;
      uStack_1370 = auVar50._16_8_;
      uStack_a10 = uStack_1370;
      uStack_1368 = auVar1._24_8_;
      uStack_a08 = uStack_1368;
      local_a40 = 0xbe2aaaa3be2aaaa3;
      uStack_a38 = 0xbe2aaaa3be2aaaa3;
      uStack_a30 = 0xbe2aaaa3be2aaaa3;
      uStack_a28 = 0xbe2aaaa3be2aaaa3;
      local_1380._0_4_ = (float)local_1380._0_4_ + -0.16666655;
      local_1380._4_4_ = (float)local_1380._4_4_ + -0.16666655;
      fVar56 = fVar56 + -0.16666655;
      fVar58 = fVar58 + -0.16666655;
      fVar60 = fVar60 + -0.16666655;
      fVar62 = fVar62 + -0.16666655;
      fVar64 = fVar64 + -0.16666655;
      uStack_1378._0_4_ = fVar56;
      uStack_1378._4_4_ = fVar58;
      uStack_1370._0_4_ = fVar60;
      uStack_1370._4_4_ = fVar62;
      auVar50 = _local_1380;
      uStack_1368._0_4_ = fVar64;
      uStack_1368._4_4_ = 0xbe225592;
      auVar1 = _local_1380;
      local_1020 = local_1380;
      uStack_1018 = uStack_1378;
      uStack_1370 = auVar50._16_8_;
      uStack_1010 = uStack_1370;
      uStack_1368 = auVar1._24_8_;
      uStack_1008 = uStack_1368;
      local_1040 = CONCAT44(fStack_135c,local_1360);
      uStack_1038 = CONCAT44(fStack_1354,fStack_1358);
      uStack_1030 = CONCAT44(fStack_134c,fStack_1350);
      uStack_1028 = CONCAT44(fStack_1344,fStack_1348);
      local_1380._0_4_ = (float)local_1380._0_4_ * local_1360;
      local_1380._4_4_ = (float)local_1380._4_4_ * fStack_135c;
      fVar56 = fVar56 * fStack_1358;
      fVar58 = fVar58 * fStack_1354;
      fVar60 = fVar60 * fStack_1350;
      fVar62 = fVar62 * fStack_134c;
      fVar64 = fVar64 * fStack_1348;
      uStack_1378._0_4_ = fVar56;
      uStack_1378._4_4_ = fVar58;
      uStack_1370._0_4_ = fVar60;
      uStack_1370._4_4_ = fVar62;
      auVar50 = _local_1380;
      uStack_1368._0_4_ = fVar64;
      uStack_1368._4_4_ = 0xbe225592;
      auVar1 = _local_1380;
      local_1060 = local_1380;
      uStack_1058 = uStack_1378;
      uStack_1370 = auVar50._16_8_;
      uStack_1050 = uStack_1370;
      uStack_1368 = auVar1._24_8_;
      uStack_1048 = uStack_1368;
      local_1080 = local_1180;
      uStack_1078 = uStack_1178;
      uStack_1070 = uStack_1170;
      uStack_1068 = uStack_1168;
      local_1380._0_4_ = (float)local_1380._0_4_ * fVar52;
      local_1380._4_4_ = (float)local_1380._4_4_ * fVar54;
      fVar56 = fVar56 * fVar55;
      fVar58 = fVar58 * fVar57;
      fVar60 = fVar60 * fVar59;
      fVar62 = fVar62 * fVar61;
      fVar64 = fVar64 * fVar63;
      uStack_1378._0_4_ = fVar56;
      uStack_1378._4_4_ = fVar58;
      uStack_1370._0_4_ = fVar60;
      uStack_1370._4_4_ = fVar62;
      auVar50 = _local_1380;
      uStack_1368._0_4_ = fVar64;
      uStack_1368._4_4_ = 0xbe225592;
      auVar1 = _local_1380;
      local_a60 = local_1380;
      uStack_a58 = uStack_1378;
      uStack_1370 = auVar50._16_8_;
      uStack_a50 = uStack_1370;
      uStack_1368 = auVar1._24_8_;
      uStack_a48 = uStack_1368;
      local_a80 = local_1180;
      uStack_a78 = uStack_1178;
      uStack_a70 = uStack_1170;
      uStack_a68 = uStack_1168;
      local_1380._4_4_ = (float)local_1380._4_4_ + fVar54;
      local_1380._0_4_ = (float)local_1380._0_4_ + fVar52;
      uStack_1378._0_4_ = fVar56 + fVar55;
      uStack_1378._4_4_ = fVar58 + fVar57;
      uStack_1370._0_4_ = fVar60 + fVar59;
      uStack_1370._4_4_ = fVar62 + fVar61;
      auVar50 = _local_1380;
      uStack_1368._0_4_ = fVar64 + fVar63;
      uStack_1368._4_4_ = fStack_1344 + -0.15852955;
      auVar1 = _local_1380;
      local_11e0 = local_1270._0_8_;
      uStack_11d8 = local_1270._8_8_;
      uStack_11d0 = local_1280._0_8_;
      uStack_11c8 = local_1280._8_8_;
      local_1100 = local_1270._0_8_;
      uStack_10f8 = local_1270._8_8_;
      uStack_10f0 = local_1280._0_8_;
      uStack_10e8 = local_1280._8_8_;
      local_1120 = local_1380;
      uStack_1118 = uStack_1378;
      uStack_1370 = auVar50._16_8_;
      uStack_1110 = uStack_1370;
      uStack_1368 = auVar1._24_8_;
      uStack_1108 = uStack_1368;
      auVar23._16_8_ = local_1280._0_8_;
      auVar23._0_16_ = local_1270;
      auVar23._24_8_ = local_1280._8_8_;
      auVar22._16_8_ = uStack_1370;
      auVar22._0_16_ = _local_1380;
      auVar22._24_8_ = uStack_1368;
      _local_1380 = vandps_avx(auVar23,auVar22);
      local_760 = local_1200;
      uStack_758 = uStack_11f8;
      uStack_11f0 = auVar51._16_8_;
      uStack_750 = uStack_11f0;
      uStack_11e8 = auVar24._24_8_;
      uStack_748 = uStack_11e8;
      local_740._0_4_ = local_1270._0_4_;
      local_740._4_4_ = local_1270._4_4_;
      uStack_738._0_4_ = local_1270._8_4_;
      uStack_738._4_4_ = local_1270._12_4_;
      uStack_730._0_4_ = local_1280._0_4_;
      uStack_730._4_4_ = local_1280._4_4_;
      uStack_728._0_4_ = local_1280._8_4_;
      uStack_728._4_4_ = local_1280._12_4_;
      auVar1 = vcmpps_avx(ZEXT832(0) << 0x20,ZEXT832(0) << 0x20,0xf);
      auVar53._0_4_ = (uint)local_740 ^ auVar1._0_4_;
      auVar53._4_4_ = local_740._4_4_ ^ auVar1._4_4_;
      auVar53._8_4_ = (uint)uStack_738 ^ auVar1._8_4_;
      auVar53._12_4_ = uStack_738._4_4_ ^ auVar1._12_4_;
      auVar53._16_4_ = (uint)uStack_730 ^ auVar1._16_4_;
      auVar53._20_4_ = uStack_730._4_4_ ^ auVar1._20_4_;
      auVar53._24_4_ = (uint)uStack_728 ^ auVar1._24_4_;
      auVar53._28_4_ = uStack_728._4_4_ ^ auVar1._28_4_;
      auVar33._16_8_ = uStack_11f0;
      auVar33._0_16_ = _local_1200;
      auVar33._24_8_ = uStack_11e8;
      auVar1 = vandps_avx(auVar53,auVar33);
      local_1200 = auVar1._0_8_;
      uVar18 = local_1200;
      uStack_11f8 = auVar1._8_8_;
      uVar19 = uStack_11f8;
      uStack_11f0 = auVar1._16_8_;
      uVar20 = uStack_11f0;
      uStack_11e8 = auVar1._24_8_;
      uVar21 = uStack_11e8;
      local_aa0._0_4_ = auVar1._0_4_;
      local_aa0._4_4_ = auVar1._4_4_;
      uStack_a98._0_4_ = auVar1._8_4_;
      uStack_a98._4_4_ = auVar1._12_4_;
      uStack_a90._0_4_ = auVar1._16_4_;
      uStack_a90._4_4_ = auVar1._20_4_;
      uStack_a88._0_4_ = auVar1._24_4_;
      uStack_a88._4_4_ = auVar1._28_4_;
      local_ac0._0_4_ = local_1380._0_4_;
      local_ac0._4_4_ = local_1380._4_4_;
      uStack_ab8._0_4_ = local_1380._8_4_;
      uStack_ab8._4_4_ = local_1380._12_4_;
      uStack_ab0._0_4_ = local_1380._16_4_;
      uStack_ab0._4_4_ = local_1380._20_4_;
      uStack_aa8._0_4_ = local_1380._24_4_;
      uStack_aa8._4_4_ = local_1380._28_4_;
      local_1200._4_4_ = local_aa0._4_4_ + local_ac0._4_4_;
      local_1200._0_4_ = (float)local_aa0 + (float)local_ac0;
      uStack_11f8._0_4_ = (float)uStack_a98 + (float)uStack_ab8;
      uStack_11f8._4_4_ = uStack_a98._4_4_ + uStack_ab8._4_4_;
      uStack_11f0._0_4_ = (float)uStack_a90 + (float)uStack_ab0;
      uStack_11f0._4_4_ = uStack_a90._4_4_ + uStack_ab0._4_4_;
      auVar50 = _local_1200;
      uStack_11e8._0_4_ = (float)uStack_a88 + (float)uStack_aa8;
      uStack_11e8._4_4_ = uStack_a88._4_4_ + uStack_aa8._4_4_;
      auVar1 = _local_1200;
      local_780 = local_1200;
      uStack_778 = uStack_11f8;
      uStack_11f0 = auVar50._16_8_;
      uStack_770 = uStack_11f0;
      uStack_11e8 = auVar1._24_8_;
      uStack_768 = uStack_11e8;
      local_7a0 = local_1250._0_8_;
      uStack_798 = local_1250._8_8_;
      uStack_790 = local_1260._0_8_;
      uStack_788 = local_1260._8_8_;
      local_1200._4_4_ = (uint)(local_aa0._4_4_ + local_ac0._4_4_) ^ local_1250._4_4_;
      local_1200._0_4_ = (uint)((float)local_aa0 + (float)local_ac0) ^ local_1250._0_4_;
      uStack_11f8._0_4_ = (uint)((float)uStack_a98 + (float)uStack_ab8) ^ local_1250._8_4_;
      uStack_11f8._4_4_ = (uint)(uStack_a98._4_4_ + uStack_ab8._4_4_) ^ local_1250._12_4_;
      uStack_11f0._0_4_ = (uint)((float)uStack_a90 + (float)uStack_ab0) ^ local_1260._0_4_;
      uStack_11f0._4_4_ = (uint)(uStack_a90._4_4_ + uStack_ab0._4_4_) ^ local_1260._4_4_;
      auVar50 = _local_1200;
      uStack_11e8._0_4_ = (uint)((float)uStack_a88 + (float)uStack_aa8) ^ local_1260._8_4_;
      uStack_11e8._4_4_ = (uint)(uStack_a88._4_4_ + uStack_aa8._4_4_) ^ local_1260._12_4_;
      auVar22 = _local_1200;
      local_1560 = local_1200;
      uStack_1558 = uStack_11f8;
      uStack_11f0 = auVar50._16_8_;
      uStack_1550 = uStack_11f0;
      uStack_11e8 = auVar22._24_8_;
      uStack_1548 = uStack_11e8;
      local_1450 = local_14f0;
      local_1480 = local_1200;
      uStack_1478 = uStack_11f8;
      uStack_1470 = uStack_11f0;
      uStack_1468 = uStack_11e8;
      auVar1._16_8_ = uStack_11f0;
      auVar1._0_16_ = _local_1200;
      auVar1._24_8_ = uStack_11e8;
      *local_14f0 = auVar1;
      local_14f0 = local_14f0 + 1;
      _local_1200 = auVar22;
      _local_1180 = auVar26;
      local_ee0 = local_f00;
      uStack_ed8 = uStack_ef8;
      uStack_ed0 = uStack_ef0;
      uStack_ec8 = uStack_ee8;
      local_ea0 = uVar6;
      uStack_e98 = uVar7;
      uStack_e90 = uVar8;
      uStack_e88 = uVar9;
      local_e10 = local_e70;
      local_e08 = local_e68;
      local_da8 = local_e68;
      local_d58 = local_db8;
      local_d48 = local_e68;
      local_cf8 = local_db8;
      local_ce8 = local_e68;
      local_cc0 = uVar10;
      uStack_cb8 = uVar11;
      uStack_cb0 = uVar12;
      uStack_ca8 = uVar13;
      local_c98 = local_e68;
      local_c88 = local_e70;
      fStack_c64 = fStack_1344;
      fStack_b04 = fStack_1344;
      fStack_ac4 = fStack_1344;
      local_ac0 = local_1380;
      uStack_ab8 = uStack_1378;
      uStack_ab0 = uStack_1370;
      uStack_aa8 = uStack_1368;
      local_aa0 = uVar18;
      uStack_a98 = uVar19;
      uStack_a90 = uVar20;
      uStack_a88 = uVar21;
      local_9a0 = uVar14;
      uStack_998 = uVar15;
      uStack_990 = uVar16;
      uStack_988 = uVar17;
      local_940 = local_960;
      uStack_938 = uStack_958;
      local_8a0 = local_8c0;
      uStack_898 = uStack_8b8;
      local_880 = local_8c0;
      uStack_878 = uStack_8b8;
      local_860 = local_8c0;
      uStack_858 = uStack_8b8;
      local_820 = local_840;
      uStack_818 = uStack_838;
      local_7b0 = local_7c0;
      local_740 = local_1270._0_8_;
      uStack_738 = local_1270._8_8_;
      uStack_730 = local_1280._0_8_;
      uStack_728 = local_1280._8_8_;
      local_700 = local_720;
      uStack_6f8 = uStack_718;
    }
    for (; local_13d8 = local_1490, local_1518 = local_1428, local_153c + 3 < local_14e4;
        local_153c = local_153c + 4) {
      local_1448 = local_14f0;
      local_5e0 = *(undefined8 *)*local_14f0;
      uStack_5d8 = *(undefined8 *)(*local_14f0 + 8);
      local_1398 = local_14c9;
      local_13a0 = &local_1570;
      local_5d0 = ZEXT816(0) << 0x20;
      local_5f0 = 0x7fffffff7fffffff;
      uStack_5e8 = 0x7fffffff7fffffff;
      auVar37._8_8_ = 0x7fffffff7fffffff;
      auVar37._0_8_ = 0x7fffffff7fffffff;
      auVar2 = vpand_avx(*(undefined1 (*) [16])*local_14f0,auVar37);
      local_640 = auVar2._0_8_;
      uVar6 = local_640;
      uStack_638 = auVar2._8_8_;
      uVar7 = uStack_638;
      local_540 = 0x3fa2f9833fa2f983;
      uStack_538 = 0x3fa2f9833fa2f983;
      local_530._0_4_ = auVar2._0_4_;
      local_530._4_4_ = auVar2._4_4_;
      uStack_528._0_4_ = auVar2._8_4_;
      uStack_528._4_4_ = auVar2._12_4_;
      local_680._4_4_ = local_530._4_4_ * 1.2732395;
      local_680._0_4_ = (float)local_530 * 1.2732395;
      uStack_678._0_4_ = (float)uStack_528 * 1.2732395;
      uStack_678._4_4_ = uStack_528._4_4_ * 1.2732395;
      local_4a0 = local_680;
      uStack_498 = uStack_678;
      local_6a0._4_4_ = (int)(local_530._4_4_ * 1.2732395);
      local_6a0._0_4_ = (int)((float)local_530 * 1.2732395);
      local_6a0._8_4_ = (int)((float)uStack_528 * 1.2732395);
      local_6a0._12_4_ = (int)(uStack_528._4_4_ * 1.2732395);
      local_510 = local_6a0._0_8_;
      uStack_508 = local_6a0._8_8_;
      local_520 = 0x100000001;
      uStack_518 = 0x100000001;
      auVar39._8_8_ = local_6a0._8_8_;
      auVar39._0_8_ = local_6a0._0_8_;
      auVar38._8_8_ = 0x100000001;
      auVar38._0_8_ = 0x100000001;
      auVar2 = vpaddd_avx(auVar39,auVar38);
      local_6a0._0_8_ = auVar2._0_8_;
      local_d0 = local_6a0._0_8_;
      local_6a0._8_8_ = auVar2._8_8_;
      uStack_c8 = local_6a0._8_8_;
      local_e0 = 0xfffffffefffffffe;
      uStack_d8 = 0xfffffffefffffffe;
      auVar43._8_8_ = 0xfffffffefffffffe;
      auVar43._0_8_ = 0xfffffffefffffffe;
      auVar3 = vpand_avx(auVar2,auVar43);
      local_6a0._0_8_ = auVar3._0_8_;
      local_490 = local_6a0._0_8_;
      local_6a0._8_8_ = auVar3._8_8_;
      uStack_488 = local_6a0._8_8_;
      auVar2 = vcvtdq2ps_avx(auVar3);
      local_110 = local_6a0._0_8_;
      uStack_108 = local_6a0._8_8_;
      local_120 = 0x200000002;
      uStack_118 = 0x200000002;
      auVar41._8_8_ = 0x200000002;
      auVar41._0_8_ = 0x200000002;
      auVar4 = vpsubd_avx(auVar3,auVar41);
      local_6a0._0_8_ = auVar4._0_8_;
      local_40 = local_6a0._0_8_;
      local_6a0._8_8_ = auVar4._8_8_;
      uStack_38 = local_6a0._8_8_;
      local_50 = 0x400000004;
      uStack_48 = 0x400000004;
      auVar46._8_8_ = 0x400000004;
      auVar46._0_8_ = 0x400000004;
      auVar3 = vpandn_avx(auVar4,auVar46);
      local_690._0_8_ = auVar3._0_8_;
      local_4f0 = local_690._0_8_;
      local_690._8_8_ = auVar3._8_8_;
      uStack_4e8 = local_690._8_8_;
      local_4f4 = 0x1d;
      local_690 = vpslld_avx(auVar3,ZEXT416(0x1d));
      local_f0 = local_6a0._0_8_;
      uStack_e8 = local_6a0._8_8_;
      auVar42._8_8_ = 0x200000002;
      auVar42._0_8_ = 0x200000002;
      auVar3 = vpand_avx(auVar4,auVar42);
      local_6a0._0_8_ = auVar3._0_8_;
      local_b0 = local_6a0._0_8_;
      local_6a0._8_8_ = auVar3._8_8_;
      uStack_a8 = local_6a0._8_8_;
      local_c0 = 0;
      local_a0._8_8_ = SUB168(ZEXT816(0),4);
      uStack_b8 = local_a0._8_8_;
      auVar49._8_8_ = 0;
      auVar49._0_8_ = local_a0._8_8_;
      local_6a0 = vpcmpeqd_avx(auVar3,auVar49 << 0x40);
      local_620 = local_690._0_8_;
      uStack_618 = local_690._8_8_;
      local_6b0 = local_690._0_8_;
      uStack_6a8 = local_690._8_8_;
      local_630 = local_6a0._0_8_;
      uStack_628 = local_6a0._8_8_;
      local_6c0 = local_6a0._0_8_;
      uStack_6b8 = local_6a0._8_8_;
      local_650 = 0xbf490000bf490000;
      uStack_648 = 0xbf490000bf490000;
      local_660 = 0xb97da000b97da000;
      uStack_658 = 0xb97da000b97da000;
      local_478 = local_680;
      local_170 = &local_650;
      local_418 = &local_640;
      local_680 = auVar2._0_8_;
      uVar8 = local_680;
      uStack_678 = auVar2._8_8_;
      uVar9 = uStack_678;
      local_160 = 0xbf490000bf490000;
      uStack_158 = 0xbf490000bf490000;
      local_150._0_4_ = auVar2._0_4_;
      local_150._4_4_ = auVar2._4_4_;
      uStack_148._0_4_ = auVar2._8_4_;
      uStack_148._4_4_ = auVar2._12_4_;
      local_130 = (float)local_150 * -0.78515625;
      fStack_12c = local_150._4_4_ * -0.78515625;
      fStack_128 = (float)uStack_148 * -0.78515625;
      fStack_124 = uStack_148._4_4_ * -0.78515625;
      local_140 = local_640;
      uStack_138 = uStack_638;
      local_640 = CONCAT44(fStack_12c + local_530._4_4_,local_130 + (float)local_530);
      uStack_638._0_4_ = fStack_128 + (float)uStack_528;
      uStack_638._4_4_ = fStack_124 + uStack_528._4_4_;
      local_1d0 = &local_660;
      local_1b0 = local_680;
      uStack_1a8 = uStack_678;
      local_1c0 = 0xb97da000b97da000;
      uStack_1b8 = 0xb97da000b97da000;
      local_190 = (float)local_150 * -0.00024187565;
      fStack_18c = local_150._4_4_ * -0.00024187565;
      fStack_188 = (float)uStack_148 * -0.00024187565;
      fStack_184 = uStack_148._4_4_ * -0.00024187565;
      local_1a0 = local_640;
      uStack_198 = uStack_638;
      fVar52 = local_190 + local_130 + (float)local_530;
      fVar54 = fStack_18c + fStack_12c + local_530._4_4_;
      fVar55 = fStack_188 + fStack_128 + (float)uStack_528;
      fVar57 = fStack_184 + fStack_124 + uStack_528._4_4_;
      local_640 = CONCAT44(fVar54,fVar52);
      uStack_638._0_4_ = fVar55;
      uStack_638._4_4_ = fVar57;
      local_230 = &local_670;
      local_210 = local_680;
      uStack_208 = uStack_678;
      local_220 = 0xb3222169b3222169;
      uStack_218 = 0xb3222169b3222169;
      local_1f0 = (float)local_150 * -3.774895e-08;
      fStack_1ec = local_150._4_4_ * -3.774895e-08;
      fStack_1e8 = (float)uStack_148 * -3.774895e-08;
      fStack_1e4 = uStack_148._4_4_ * -3.774895e-08;
      local_200 = local_640;
      uStack_1f8 = uStack_638;
      fVar52 = local_1f0 + fVar52;
      fVar54 = fStack_1ec + fVar54;
      fVar55 = fStack_1e8 + fVar55;
      fVar57 = fStack_1e4 + fVar57;
      local_640 = CONCAT44(fVar54,fVar52);
      uStack_638._0_4_ = fVar55;
      uStack_638._4_4_ = fVar57;
      local_560 = local_640;
      uStack_558 = uStack_638;
      local_6d0 = fVar52 * fVar52;
      fStack_6cc = fVar54 * fVar54;
      fStack_6c8 = fVar55 * fVar55;
      fStack_6c4 = fVar57 * fVar57;
      local_468 = &local_6d0;
      local_298 = _ps_coscof_p1;
      local_270 = 0x37ccf5ce37ccf5ce;
      uStack_268 = 0x37ccf5ce37ccf5ce;
      local_280 = CONCAT44(fStack_6cc,local_6d0);
      uStack_278 = CONCAT44(fStack_6c4,fStack_6c8);
      local_250 = local_6d0 * 2.4433157e-05;
      fStack_24c = fStack_6cc * 2.4433157e-05;
      fStack_248 = fStack_6c8 * 2.4433157e-05;
      fStack_244 = fStack_6c4 * 2.4433157e-05;
      local_260[0] = -0.0013887316;
      local_260[1] = -0.0013887316;
      afStack_258[0] = -0.0013887316;
      afStack_258[1] = -0.0013887316;
      local_680._4_4_ = fStack_24c + -0.0013887316;
      local_680._0_4_ = local_250 + -0.0013887316;
      uStack_678._0_4_ = fStack_248 + -0.0013887316;
      uStack_678._4_4_ = fStack_244 + -0.0013887316;
      local_2f8 = _ps_coscof_p2;
      local_2d0 = local_680;
      uStack_2c8 = uStack_678;
      local_2e0 = CONCAT44(fStack_6cc,local_6d0);
      uStack_2d8 = CONCAT44(fStack_6c4,fStack_6c8);
      local_2b0 = (local_250 + -0.0013887316) * local_6d0;
      fStack_2ac = (fStack_24c + -0.0013887316) * fStack_6cc;
      fStack_2a8 = (fStack_248 + -0.0013887316) * fStack_6c8;
      fStack_2a4 = (fStack_244 + -0.0013887316) * fStack_6c4;
      local_2c0[0] = 0.041666646;
      local_2c0[1] = 0.041666646;
      afStack_2b8[0] = 0.041666646;
      afStack_2b8[1] = 0.041666646;
      local_680._4_4_ = fStack_2ac + 0.041666646;
      local_680._0_4_ = local_2b0 + 0.041666646;
      uStack_678._0_4_ = fStack_2a8 + 0.041666646;
      uStack_678._4_4_ = fStack_2a4 + 0.041666646;
      local_570 = local_680;
      uStack_568 = uStack_678;
      local_580 = CONCAT44(fStack_6cc,local_6d0);
      uStack_578 = CONCAT44(fStack_6c4,fStack_6c8);
      local_680._0_4_ = (local_2b0 + 0.041666646) * local_6d0;
      local_680._4_4_ = (fStack_2ac + 0.041666646) * fStack_6cc;
      fVar56 = (fStack_2a8 + 0.041666646) * fStack_6c8;
      fVar58 = (fStack_2a4 + 0.041666646) * fStack_6c4;
      uStack_678._0_4_ = fVar56;
      uStack_678._4_4_ = fVar58;
      local_590 = local_680;
      uStack_588 = uStack_678;
      local_5a0 = CONCAT44(fStack_6cc,local_6d0);
      uStack_598 = CONCAT44(fStack_6c4,fStack_6c8);
      local_680._4_4_ = (float)local_680._4_4_ * fStack_6cc;
      local_680._0_4_ = (float)local_680._0_4_ * local_6d0;
      uStack_678._0_4_ = fVar56 * fStack_6c8;
      uStack_678._4_4_ = fVar58 * fStack_6c4;
      local_470 = ::_ps_0p5;
      local_450 = local_680;
      uStack_448 = uStack_678;
      local_430 = CONCAT44(fStack_6cc,local_6d0);
      uStack_428 = CONCAT44(fStack_6c4,fStack_6c8);
      local_440[0] = 0.5;
      local_440[1] = 0.5;
      afStack_438[0] = 0.5;
      afStack_438[1] = 0.5;
      local_460 = local_6d0 * 0.5;
      fStack_45c = fStack_6cc * 0.5;
      fStack_458 = fStack_6c8 * 0.5;
      fStack_454 = fStack_6c4 * 0.5;
      auVar40._4_4_ = fStack_45c;
      auVar40._0_4_ = local_460;
      auVar40._8_4_ = fStack_458;
      auVar40._12_4_ = fStack_454;
      auVar2 = vsubps_avx(_local_680,auVar40);
      local_680 = auVar2._0_8_;
      uVar10 = local_680;
      uStack_678 = auVar2._8_8_;
      uVar11 = uStack_678;
      local_4c0 = 0x3f8000003f800000;
      uStack_4b8 = 0x3f8000003f800000;
      local_4b0._0_4_ = auVar2._0_4_;
      local_4b0._4_4_ = auVar2._4_4_;
      uStack_4a8._0_4_ = auVar2._8_4_;
      uStack_4a8._4_4_ = auVar2._12_4_;
      local_680._4_4_ = local_4b0._4_4_ + 1.0;
      local_680._0_4_ = (float)local_4b0 + 1.0;
      uStack_678._0_4_ = (float)uStack_4a8 + 1.0;
      uStack_678._4_4_ = uStack_4a8._4_4_ + 1.0;
      local_408 = local_6e0;
      local_358 = _ps_sincof_p1;
      local_330 = 0xb94ca1f9b94ca1f9;
      uStack_328 = 0xb94ca1f9b94ca1f9;
      local_340 = CONCAT44(fStack_6cc,local_6d0);
      uStack_338 = CONCAT44(fStack_6c4,fStack_6c8);
      local_310 = local_6d0 * -0.00019515296;
      fStack_30c = fStack_6cc * -0.00019515296;
      fStack_308 = fStack_6c8 * -0.00019515296;
      fStack_304 = fStack_6c4 * -0.00019515296;
      local_320[0] = 0.008332161;
      local_320[1] = 0.008332161;
      afStack_318[0] = 0.008332161;
      afStack_318[1] = 0.008332161;
      local_6e0._4_4_ = fStack_30c + 0.008332161;
      local_6e0._0_4_ = local_310 + 0.008332161;
      uStack_6d8._0_4_ = fStack_308 + 0.008332161;
      uStack_6d8._4_4_ = fStack_304 + 0.008332161;
      local_3b8 = _ps_sincof_p2;
      local_390 = local_6e0;
      uStack_388 = uStack_6d8;
      local_3a0 = CONCAT44(fStack_6cc,local_6d0);
      uStack_398 = CONCAT44(fStack_6c4,fStack_6c8);
      local_370 = (local_310 + 0.008332161) * local_6d0;
      fStack_36c = (fStack_30c + 0.008332161) * fStack_6cc;
      fStack_368 = (fStack_308 + 0.008332161) * fStack_6c8;
      fStack_364 = (fStack_304 + 0.008332161) * fStack_6c4;
      local_380[0] = -0.16666655;
      local_380[1] = -0.16666655;
      afStack_378[0] = -0.16666655;
      afStack_378[1] = -0.16666655;
      local_6e0._4_4_ = fStack_36c + -0.16666655;
      local_6e0._0_4_ = local_370 + -0.16666655;
      uStack_6d8._0_4_ = fStack_368 + -0.16666655;
      uStack_6d8._4_4_ = fStack_364 + -0.16666655;
      local_5b0 = local_6e0;
      uStack_5a8 = uStack_6d8;
      local_5c0 = CONCAT44(fStack_6cc,local_6d0);
      uStack_5b8 = CONCAT44(fStack_6c4,fStack_6c8);
      local_6e0._0_4_ = (local_370 + -0.16666655) * local_6d0;
      local_6e0._4_4_ = (fStack_36c + -0.16666655) * fStack_6cc;
      fStack_3c8 = (fStack_368 + -0.16666655) * fStack_6c8;
      fStack_3c4 = (fStack_364 + -0.16666655) * fStack_6c4;
      uStack_6d8._0_4_ = fStack_3c8;
      uStack_6d8._4_4_ = fStack_3c4;
      local_3f0 = local_6e0;
      uStack_3e8 = uStack_6d8;
      local_400 = local_640;
      uStack_3f8 = uStack_638;
      local_3d0 = (float)local_6e0._0_4_ * fVar52;
      fStack_3cc = (float)local_6e0._4_4_ * fVar54;
      fStack_3c8 = fStack_3c8 * fVar55;
      fStack_3c4 = fStack_3c4 * fVar57;
      local_3e0 = local_640;
      uStack_3d8 = uStack_638;
      local_6e0._4_4_ = fStack_3cc + fVar54;
      local_6e0._0_4_ = local_3d0 + fVar52;
      uStack_6d8._0_4_ = fStack_3c8 + fVar55;
      uStack_6d8._4_4_ = fStack_3c4 + fVar57;
      local_670 = local_6a0._0_8_;
      uStack_668 = local_6a0._8_8_;
      local_600 = local_6a0._0_8_;
      uStack_5f8 = local_6a0._8_8_;
      local_610 = local_6e0;
      uStack_608 = uStack_6d8;
      auVar36._8_8_ = uStack_6d8;
      auVar36._0_8_ = local_6e0;
      _local_6e0 = vpand_avx(local_6a0,auVar36);
      local_70 = local_680;
      uStack_68 = uStack_678;
      auVar2 = vpcmpeqd_avx(local_6a0,local_6a0);
      auVar45._8_8_ = uStack_678;
      auVar45._0_8_ = local_680;
      auVar2 = vpand_avx(local_6a0 ^ auVar2,auVar45);
      local_680 = auVar2._0_8_;
      uVar12 = local_680;
      uStack_678 = auVar2._8_8_;
      uVar13 = uStack_678;
      local_4d0._0_4_ = auVar2._0_4_;
      local_4d0._4_4_ = auVar2._4_4_;
      uStack_4c8._0_4_ = auVar2._8_4_;
      uStack_4c8._4_4_ = auVar2._12_4_;
      local_4e0._0_4_ = local_6e0._0_4_;
      local_4e0._4_4_ = local_6e0._4_4_;
      uStack_4d8._0_4_ = local_6e0._8_4_;
      uStack_4d8._4_4_ = local_6e0._12_4_;
      local_680._4_4_ = local_4d0._4_4_ + local_4e0._4_4_;
      local_680._0_4_ = (float)local_4d0 + (float)local_4e0;
      uStack_678._0_4_ = (float)uStack_4c8 + (float)uStack_4d8;
      uStack_678._4_4_ = uStack_4c8._4_4_ + uStack_4d8._4_4_;
      local_80 = local_680;
      uStack_78 = uStack_678;
      local_90 = local_690._0_8_;
      uStack_88 = local_690._8_8_;
      auVar44._8_8_ = uStack_678;
      auVar44._0_8_ = local_680;
      _local_680 = auVar44 ^ local_690;
      local_1570 = local_680;
      uStack_1568 = uStack_678;
      local_1430 = local_14f0;
      local_1440 = local_680;
      uStack_1438 = uStack_678;
      *(undefined1 (*) [16])*local_14f0 = _local_680;
      local_14f0 = (undefined1 (*) [32])(*local_14f0 + 0x10);
      local_550 = local_560;
      uStack_548 = uStack_558;
      local_530 = uVar6;
      uStack_528 = uVar7;
      local_4e0 = local_6e0;
      uStack_4d8 = uStack_6d8;
      local_4d0 = uVar12;
      uStack_4c8 = uVar13;
      local_4b0 = uVar10;
      uStack_4a8 = uVar11;
      local_410 = local_418;
      local_3b0 = local_468;
      local_3a8 = local_408;
      local_350 = local_468;
      local_348 = local_408;
      local_2f0 = local_468;
      local_2e8 = local_478;
      local_290 = local_468;
      local_288 = local_478;
      local_238 = local_418;
      local_228 = local_478;
      local_1d8 = local_418;
      local_1c8 = local_478;
      local_178 = local_418;
      local_168 = local_478;
      local_150 = uVar8;
      uStack_148 = uVar9;
      local_100 = local_120;
      uStack_f8 = uStack_118;
      local_a0 = ZEXT816(0) << 0x20;
      local_60 = local_6a0;
    }
    for (; local_153c < local_14e4; local_153c = local_153c + 1) {
      local_1388 = local_14c9;
      local_1390 = local_14f0;
      fVar52 = cosf(*(float *)*local_14f0);
      *(float *)*local_14f0 = fVar52;
      local_14f0 = (undefined1 (*) [32])(*local_14f0 + 4);
    }
  }
  return 0;
}

Assistant:

static int unary_op_inplace(Mat& a, const Option& opt)
{
    Op op;

    int w = a.w;
    int h = a.h;
    int d = a.d;
    int channels = a.c;
    int elempack = a.elempack;
    int size = w * h * d * elempack;

    #pragma omp parallel for num_threads(opt.num_threads)
    for (int q = 0; q < channels; q++)
    {
        float* ptr = a.channel(q);

        int i = 0;
#if __SSE2__
#if __AVX__
#if __AVX512F__
        for (; i + 15 < size; i += 16)
        {
            __m512 _p = _mm512_loadu_ps(ptr);
            _p = op.func_pack16(_p);
            _mm512_storeu_ps(ptr, _p);
            ptr += 16;
        }
#endif // __AVX512F__
        for (; i + 7 < size; i += 8)
        {
            __m256 _p = _mm256_loadu_ps(ptr);
            _p = op.func_pack8(_p);
            _mm256_storeu_ps(ptr, _p);
            ptr += 8;
        }
#endif // __AVX__
        for (; i + 3 < size; i += 4)
        {
            __m128 _p = _mm_load_ps(ptr);
            _p = op.func_pack4(_p);
            _mm_store_ps(ptr, _p);
            ptr += 4;
        }
#endif // __SSE2__
        for (; i < size; i++)
        {
            *ptr = op.func(*ptr);
            ptr++;
        }
    }

    return 0;
}